

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader.cpp
# Opt level: O0

void __thiscall
COLLADASaxFWL::LibraryEffectsLoader::~LibraryEffectsLoader(LibraryEffectsLoader *this)

{
  ColorOrTexture *in_RDI;
  
  (in_RDI->mColor).super_Animatable._vptr_Animatable =
       (_func_int **)&PTR__LibraryEffectsLoader_00dbf640;
  std::__cxx11::string::~string((string *)in_RDI[4].mColor.mSid.field_2._M_local_buf);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *)0xb2e0ae);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo>_>_>
          *)0xb2e0bf);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::SamplerInfo>_>_>
          *)0xb2e0d0);
  std::__cxx11::string::~string
            ((string *)
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
               *)&in_RDI[3].mColor + 3));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface>_>_>
          *)0xb2e0f2);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_COLLADASaxFWL::LibraryEffectsLoader::Surface>_>_>
          *)0xb2e103);
  std::__cxx11::string::~string((string *)&in_RDI[2].mTexture);
  Surface::~Surface((Surface *)0xb2e125);
  std::__cxx11::string::~string((string *)((long)&in_RDI[2].mColor + 0x28));
  COLLADAFW::FloatOrParam::~FloatOrParam((FloatOrParam *)in_RDI);
  COLLADAFW::ColorOrTexture::~ColorOrTexture(in_RDI);
  LibraryImagesLoader::~LibraryImagesLoader((LibraryImagesLoader *)0xb2e15f);
  return;
}

Assistant:

LibraryEffectsLoader::~LibraryEffectsLoader()
	{
	}